

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::BasicSolver::BasicSolver
          (BasicSolver *this,CStringRef name,CStringRef long_name,long date,int flags)

{
  ErrorHandler *in_RDI;
  int in_stack_00000124;
  long in_stack_00000128;
  BasicSolver *in_stack_00000130;
  CStringRef in_stack_00000138;
  CStringRef in_stack_00000140;
  SolveResultRegistry *in_stack_00000360;
  SolverOptionManager *in_stack_ffffffffffffff40;
  Stats *this_00;
  
  ErrorHandler::ErrorHandler(in_RDI);
  OutputHandler::OutputHandler((OutputHandler *)(in_RDI + 1));
  Interrupter::Interrupter((Interrupter *)(in_RDI + 4));
  SolverOptionManager::SolverOptionManager(in_stack_ffffffffffffff40);
  SolveResultRegistry::SolveResultRegistry(in_stack_00000360);
  in_RDI->_vptr_ErrorHandler = (_func_int **)&PTR__BasicSolver_003a4fc0;
  in_RDI[1]._vptr_ErrorHandler = (_func_int **)&PTR__BasicSolver_003a5030;
  in_RDI[4]._vptr_ErrorHandler = (_func_int **)&PTR__BasicSolver_003a5058;
  in_RDI[5]._vptr_ErrorHandler = (_func_int **)&PTR__BasicSolver_003a5088;
  in_RDI[0x10]._vptr_ErrorHandler = (_func_int **)&PTR__BasicSolver_003a50a8;
  this_00 = (Stats *)(in_RDI + 0x17);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string((string *)(in_RDI + 0x1b));
  std::__cxx11::string::string((string *)(in_RDI + 0x1f));
  std::__cxx11::string::string((string *)(in_RDI + 0x23));
  std::__cxx11::string::string((string *)(in_RDI + 0x27));
  std::__cxx11::string::string((string *)(in_RDI + 0x2b));
  in_RDI[0x2f]._vptr_ErrorHandler = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[0x30]._vptr_ErrorHandler = 0;
  *(undefined4 *)((long)&in_RDI[0x30]._vptr_ErrorHandler + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x31]._vptr_ErrorHandler = 0xffffffff;
  *(undefined1 *)((long)&in_RDI[0x31]._vptr_ErrorHandler + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x31]._vptr_ErrorHandler + 5) = 0;
  *(undefined4 *)&in_RDI[0x32]._vptr_ErrorHandler = 0;
  *(undefined4 *)((long)&in_RDI[0x32]._vptr_ErrorHandler + 4) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x33));
  std::__cxx11::string::string((string *)(in_RDI + 0x37));
  *(undefined1 *)&in_RDI[0x3b]._vptr_ErrorHandler = 0;
  *(undefined4 *)((long)&in_RDI[0x3b]._vptr_ErrorHandler + 4) = 0;
  *(undefined1 *)&in_RDI[0x3c]._vptr_ErrorHandler = 0;
  *(undefined1 *)((long)&in_RDI[0x3c]._vptr_ErrorHandler + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x3c]._vptr_ErrorHandler + 2) = 1;
  *(undefined4 *)((long)&in_RDI[0x3c]._vptr_ErrorHandler + 4) = 0;
  Stats::Stats(this_00);
  std::function<std::pair<const_char_*,_const_char_*>_(const_char_*)>::function
            ((function<std::pair<const_char_*,_const_char_*>_(const_char_*)> *)this_00);
  *(undefined4 *)&in_RDI[0x48]._vptr_ErrorHandler = 0;
  *(undefined1 *)((long)&in_RDI[0x48]._vptr_ErrorHandler + 4) = 0;
  *(undefined4 *)&in_RDI[0x49]._vptr_ErrorHandler = 2;
  *(undefined1 *)((long)&in_RDI[0x49]._vptr_ErrorHandler + 4) = 0;
  in_RDI[0x4a]._vptr_ErrorHandler = (_func_int **)(in_RDI + 1);
  in_RDI[0x4b]._vptr_ErrorHandler = (_func_int **)in_RDI;
  in_RDI[0x4c]._vptr_ErrorHandler = (_func_int **)(in_RDI + 4);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *)0x2bd361);
  std::__cxx11::string::string((string *)(in_RDI + 0x53));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2bd38d);
  InitMetaInfoAndOptions
            (in_stack_00000130,in_stack_00000140,in_stack_00000138,in_stack_00000128,
             in_stack_00000124);
  return;
}

Assistant:

BasicSolver::BasicSolver(
    fmt::CStringRef name, fmt::CStringRef long_name, long date, int flags) {
  InitMetaInfoAndOptions(name, long_name, date, flags);
}